

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_bindings
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *bindings,
          VkDescriptorSetLayoutBinding **out_bindings)

{
  size_t size;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  Number NVar6;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  VkSampler **out_sampler;
  VkDescriptorSetLayoutBinding *local_60;
  undefined8 local_38;
  
  if ((bindings->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar3 = (ulong)(bindings->data_).s.length;
  if (uVar3 == 0) {
    local_60 = (VkDescriptorSetLayoutBinding *)0x0;
  }
  else {
    size = uVar3 * 0x18;
    local_60 = (VkDescriptorSetLayoutBinding *)
               ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_60 != (VkDescriptorSetLayoutBinding *)0x0) {
      memset(local_60,0,size);
    }
    if ((bindings->data_).f.flags != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x68c,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(bindings->data_).s.str & 0xffffffffffff);
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(bindings);
  if (pGVar4 != this_00) {
    out_sampler = &local_60->pImmutableSamplers;
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"binding");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_0014fc97:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      ((VkDescriptorSetLayoutBinding *)(out_sampler + -2))->binding = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"descriptorCount");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0014fc97;
      *(SizeType *)(out_sampler + -1) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"descriptorType");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0014fc97;
      *(SizeType *)((long)out_sampler + -0xc) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"stageFlags");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0014fc97;
      *(SizeType *)((long)out_sampler + -4) = (pGVar5->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)this_00);
      uVar1 = local_38;
      NVar6.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_00);
      if (uVar1 != NVar6.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"immutableSamplers");
        bVar2 = parse_immutable_samplers(this,iface,resolver,pGVar5,out_sampler);
        if (!bVar2) {
          return false;
        }
      }
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(bindings);
      out_sampler = out_sampler + 3;
    } while (this_00 != pGVar4);
  }
  *out_bindings = local_60;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_bindings(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &bindings,
                                                        const VkDescriptorSetLayoutBinding **out_bindings)
{
	auto *set_bindings = allocator.allocate_n_cleared<VkDescriptorSetLayoutBinding>(bindings.Size());
	auto *ret = set_bindings;
	for (auto itr = bindings.Begin(); itr != bindings.End(); ++itr, set_bindings++)
	{
		auto &b = *itr;
		set_bindings->binding = b["binding"].GetUint();
		set_bindings->descriptorCount = b["descriptorCount"].GetUint();
		set_bindings->descriptorType = static_cast<VkDescriptorType>(b["descriptorType"].GetUint());
		set_bindings->stageFlags = b["stageFlags"].GetUint();
		if (b.HasMember("immutableSamplers"))
		{
			if (!parse_immutable_samplers(iface, resolver,
			                              b["immutableSamplers"], &set_bindings->pImmutableSamplers))
			{
				return false;
			}
		}
	}

	*out_bindings = ret;
	return true;
}